

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesDeviceEnumPowerDomains
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_pwr_handle_t *phPower)

{
  zes_pwr_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  zes_pfnDeviceEnumPowerDomains_t pfnEnumPowerDomains;
  ze_result_t result;
  zes_pwr_handle_t *phPower_local;
  uint32_t *pCount_local;
  zes_device_handle_t hDevice_local;
  
  pfnEnumPowerDomains._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ca50 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phPower != (zes_pwr_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (zes_pwr_handle_t)context_t::get((context_t *)&context);
      phPower[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnEnumPowerDomains._4_4_ = (*DAT_0011ca50)(hDevice,pCount,phPower);
  }
  return pfnEnumPowerDomains._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceEnumPowerDomains(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle of the device.
        uint32_t* pCount,                               ///< [in,out] pointer to the number of components of this type.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of components of this type that are available.
                                                        ///< if count is greater than the number of components of this type that
                                                        ///< are available, then the driver shall update the value with the correct
                                                        ///< number of components.
        zes_pwr_handle_t* phPower                       ///< [in,out][optional][range(0, *pCount)] array of handle of components of
                                                        ///< this type.
                                                        ///< if count is less than the number of components of this type that are
                                                        ///< available, then the driver shall only retrieve that number of
                                                        ///< component handles.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEnumPowerDomains = context.zesDdiTable.Device.pfnEnumPowerDomains;
        if( nullptr != pfnEnumPowerDomains )
        {
            result = pfnEnumPowerDomains( hDevice, pCount, phPower );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phPower ) && ( i < *pCount ); ++i )
                phPower[ i ] = reinterpret_cast<zes_pwr_handle_t>( context.get() );

        }

        return result;
    }